

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O1

PaDeviceIndex Pa_GetDefaultOutputDevice(void)

{
  uint uVar1;
  
  if (initializationCount_ == 0) {
    uVar1 = 0xffffd8f0;
  }
  else {
    uVar1 = 0xffffd8fe;
    if (defaultHostApiIndex_ < hostApisCount_) {
      uVar1 = defaultHostApiIndex_;
    }
    if (defaultHostApiIndex_ < 0) {
      uVar1 = 0xffffd8fe;
    }
  }
  if ((int)uVar1 < 0) {
    return -1;
  }
  return (hostApis_[uVar1]->info).defaultOutputDevice;
}

Assistant:

PaHostApiIndex Pa_GetDefaultHostApi( void )
{
    int result;

    PA_LOGAPI_ENTER( "Pa_GetDefaultHostApi" );

    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
    }
    else
    {
        result = defaultHostApiIndex_;

        /* internal consistency check: make sure that the default host api
         index is within range */

        if( result < 0 || result >= hostApisCount_ )
        {
            result = paInternalError;
        }
    }

    PA_LOGAPI_EXIT_PAERROR_OR_T_RESULT( "Pa_GetDefaultHostApi", "PaHostApiIndex: %d", result );

    return result;
}